

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

void xmlDumpAttributeTable(xmlBufferPtr buf,xmlAttributeTablePtr table)

{
  xmlFreeFunc p_Var1;
  int iVar2;
  xmlSaveCtxtPtr ctxt;
  xmlChar *pxVar3;
  xmlSaveCtxtPtr save;
  xmlAttributeTablePtr table_local;
  xmlBufferPtr buf_local;
  
  if ((buf != (xmlBufferPtr)0x0) && (table != (xmlAttributeTablePtr)0x0)) {
    ctxt = xmlSaveToBuffer(buf,(char *)0x0,0);
    xmlHashScan(table,xmlDumpAttributeDeclScan,ctxt);
    iVar2 = xmlSaveFinish(ctxt);
    p_Var1 = xmlFree;
    if (iVar2 != 0) {
      pxVar3 = xmlBufferDetach(buf);
      (*p_Var1)(pxVar3);
    }
  }
  return;
}

Assistant:

void
xmlDumpAttributeTable(xmlBufferPtr buf, xmlAttributeTablePtr table) {
    xmlSaveCtxtPtr save;

    if ((buf == NULL) || (table == NULL))
        return;

    save = xmlSaveToBuffer(buf, NULL, 0);
    xmlHashScan(table, xmlDumpAttributeDeclScan, save);
    if (xmlSaveFinish(save) != XML_ERR_OK)
        xmlFree(xmlBufferDetach(buf));
}